

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

u32string *
anon_unknown.dwarf_eb88::cpputf8_u16_to_u32(u32string *__return_storage_ptr__,u16string *u16)

{
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  start;
  back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  in_RCX;
  string u8;
  utf8 *local_40;
  long local_38;
  utf8 local_30;
  undefined7 uStack_2f;
  
  local_38 = 0;
  local_30 = (utf8)0x0;
  start._M_current = (u16->_M_dataplus)._M_p;
  local_40 = &local_30;
  utf8::
  utf16to8<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,std::back_insert_iterator<std::__cxx11::string>>
            (start,(__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                    )(start._M_current + u16->_M_string_length),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  utf8::
  utf8to32<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::u32string>>
            (local_40,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )(local_40 + local_38),
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__,in_RCX);
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline
u32string cpputf8_u16_to_u32(const u16string& u16)
{
    // cpputf8 doesn't support this directly (it is, after all, designed to
    // handle UTF-8), so we need to do it in two steps
    const string u8 = cpputf8_u16_to_u8(u16);
    return cpputf8_u8_to_u32(u8);
}